

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O1

void duckdb_je_buf_writer_cb(void *buf_writer_arg,char *s)

{
  size_t sVar1;
  ulong __n;
  ulong uVar2;
  
  if (*(long *)((long)buf_writer_arg + 0x10) != 0) {
    sVar1 = strlen(s);
    if (sVar1 != 0) {
      uVar2 = 0;
      do {
        if ((*(long *)((long)buf_writer_arg + 0x20) == *(long *)((long)buf_writer_arg + 0x18)) &&
           (*(long *)((long)buf_writer_arg + 0x10) != 0)) {
          *(undefined1 *)
           (*(long *)((long)buf_writer_arg + 0x10) + *(long *)((long)buf_writer_arg + 0x20)) = 0;
          (**buf_writer_arg)(*(undefined8 *)((long)buf_writer_arg + 8),
                             *(undefined8 *)((long)buf_writer_arg + 0x10));
          *(undefined8 *)((long)buf_writer_arg + 0x20) = 0;
        }
        __n = *(long *)((long)buf_writer_arg + 0x18) - *(long *)((long)buf_writer_arg + 0x20);
        if (sVar1 - uVar2 < __n) {
          __n = sVar1 - uVar2;
        }
        switchD_00b1522a::default
                  ((void *)(*(long *)((long)buf_writer_arg + 0x20) +
                           *(long *)((long)buf_writer_arg + 0x10)),s + uVar2,__n);
        *(long *)((long)buf_writer_arg + 0x20) = *(long *)((long)buf_writer_arg + 0x20) + __n;
        uVar2 = uVar2 + __n;
      } while (uVar2 < sVar1);
    }
    return;
  }
  (**buf_writer_arg)(*(undefined8 *)((long)buf_writer_arg + 8),s);
  return;
}

Assistant:

void
buf_writer_cb(void *buf_writer_arg, const char *s) {
	buf_writer_t *buf_writer = (buf_writer_t *)buf_writer_arg;
	buf_writer_assert(buf_writer);
	if (buf_writer->buf == NULL) {
		buf_writer->write_cb(buf_writer->cbopaque, s);
		return;
	}
	size_t i, slen, n;
	for (i = 0, slen = strlen(s); i < slen; i += n) {
		if (buf_writer->buf_end == buf_writer->buf_size) {
			buf_writer_flush(buf_writer);
		}
		size_t s_remain = slen - i;
		size_t buf_remain = buf_writer->buf_size - buf_writer->buf_end;
		n = s_remain < buf_remain ? s_remain : buf_remain;
		memcpy(buf_writer->buf + buf_writer->buf_end, s + i, n);
		buf_writer->buf_end += n;
		buf_writer_assert(buf_writer);
	}
	assert(i == slen);
}